

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.h
# Opt level: O0

void __thiscall xLearn::Trainer::SaveModel(Trainer *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ostream *poVar6;
  char *in_RSI;
  Model *in_RDI;
  Logger *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  LogSeverity severity;
  string *in_stack_ffffffffffffff28;
  allocator *paVar7;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  char *local_10;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_10 = in_RSI;
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    Logger::Logger(&local_14,ERR);
    paVar7 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.h"
               ,paVar7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"SaveModel",&local_71);
    poVar5 = Logger::Start(severity,in_stack_fffffffffffffec8,iVar4,in_stack_fffffffffffffeb8);
    poVar5 = std::operator<<(poVar5,"CHECK_NE failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.h"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4f);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"filename.empty()");
    poVar5 = std::operator<<(poVar5," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,bVar2);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"true");
    poVar5 = std::operator<<(poVar5," = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,true);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger(in_stack_fffffffffffffe50);
    abort();
  }
  iVar3 = std::__cxx11::string::compare(local_10);
  if (iVar3 == 0) {
    Logger::Logger(&local_78,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.h"
               ,&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"SaveModel",&local_c1);
    poVar5 = Logger::Start(severity,in_stack_fffffffffffffec8,iVar4,in_stack_fffffffffffffeb8);
    poVar5 = std::operator<<(poVar5,"CHECK_NE failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.h"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x50);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"filename.compare(\"none\")");
    poVar5 = std::operator<<(poVar5," = ");
    iVar4 = std::__cxx11::string::compare(local_10);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"0");
    poVar6 = std::operator<<(poVar5," = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    Logger::~Logger((Logger *)poVar5);
    abort();
  }
  Model::Serialize(in_RDI,in_stack_ffffffffffffff28);
  return;
}

Assistant:

void SaveModel(const std::string& filename) {
    CHECK_NE(filename.empty(), true);
    CHECK_NE(filename.compare("none"), 0);
    model_->Serialize(filename);
  }